

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O1

void duckdb::WriteDataToPrimitiveSegment<int>
               (ListSegmentFunctions *param_1,ArenaAllocator *param_2,ListSegment *segment,
               RecursiveUnifiedVectorFormat *input_data,idx_t *entry_idx)

{
  ushort uVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar4 = *entry_idx;
  psVar2 = ((input_data->unified).sel)->sel_vector;
  if (psVar2 != (sel_t *)0x0) {
    uVar4 = (ulong)psVar2[uVar4];
  }
  puVar3 = (input_data->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if (puVar3 == (unsigned_long *)0x0) {
    bVar5 = true;
  }
  else {
    bVar5 = (puVar3[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0;
  }
  uVar1 = segment->count;
  *(byte *)((long)&segment[1].count + (ulong)uVar1) = bVar5 ^ 1U;
  if (!(bool)(bVar5 ^ 1U)) {
    *(undefined4 *)((long)&segment[1].count + (ulong)uVar1 * 4 + (ulong)segment->capacity) =
         *(undefined4 *)((input_data->unified).data + uVar4 * 4);
  }
  return;
}

Assistant:

static void WriteDataToPrimitiveSegment(const ListSegmentFunctions &, ArenaAllocator &, ListSegment *segment,
                                        RecursiveUnifiedVectorFormat &input_data, idx_t &entry_idx) {

	auto sel_entry_idx = input_data.unified.sel->get_index(entry_idx);

	// write null validity
	auto null_mask = GetNullMask(segment);
	auto valid = input_data.unified.validity.RowIsValid(sel_entry_idx);
	null_mask[segment->count] = !valid;

	// write value
	if (valid) {
		auto segment_data = GetPrimitiveData<T>(segment);
		auto input_data_ptr = UnifiedVectorFormat::GetData<T>(input_data.unified);
		Store<T>(input_data_ptr[sel_entry_idx], data_ptr_cast(segment_data + segment->count));
	}
}